

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O1

void __thiscall
duckdb::ReduceExecuteInfo::ReduceExecuteInfo
          (ReduceExecuteInfo *this,LambdaInfo *info,ClientContext *context)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  ulong *puVar1;
  Vector *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  Expression *expression;
  ExpressionExecutor *__ptr;
  byte bVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_02;
  TemplatedValidityData<unsigned_long> *pTVar8;
  pointer pVVar9;
  reference pvVar10;
  ExpressionExecutor *this_03;
  ParameterNotAllowedException *this_04;
  ulong uVar11;
  idx_t count;
  idx_t idx_in_entry;
  ulong uVar12;
  size_type __n;
  SelectionVector left_vector;
  string local_88;
  default_delete<duckdb::ExpressionExecutor> *local_60;
  idx_t local_58;
  ClientContext *local_50;
  SelectionVector local_48;
  
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&info->child_vector);
  other = (info->child_vector).ptr;
  this_02._M_head_impl = (Vector *)operator_new(0x68);
  Vector::Vector(this_02._M_head_impl,other);
  (this->left_slice).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_02._M_head_impl;
  (this->expr_executor).
  super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl =
       (ExpressionExecutor *)0x0;
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->initial_value_offset = 1;
  (this->left_sel).sel_vector = (sel_t *)0x0;
  (this->left_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->left_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->active_rows_sel).sel_vector = (sel_t *)0x0;
  (this->active_rows_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->active_rows_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (info->has_initial == true) {
    this->initial_value_offset = 0;
  }
  this_00 = &this->left_slice;
  local_60 = (default_delete<duckdb::ExpressionExecutor> *)&this->expr_executor;
  this_01 = &this->input_types;
  local_50 = context;
  SelectionVector::SelectionVector(&local_48,info->row_count);
  ValidityMask::Resize(&this->active_rows,info->row_count);
  uVar12 = info->row_count;
  if ((this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    local_58 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_88,&local_58);
    sVar7 = local_88._M_string_length;
    _Var6._M_p = local_88._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    p_Var2 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var6._M_p;
    (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
    }
    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(this->active_rows).super_TemplatedValidityMask<unsigned_long>.
                         validity_data);
    (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (pTVar8->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
  }
  if (uVar12 != 0) {
    uVar11 = uVar12 + 0x3f >> 6;
    if (uVar11 != 1) {
      switchD_0130b471::default
                ((this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask,0xff,
                 uVar11 * 8 - 8);
    }
    puVar1 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask +
             (uVar11 - 1);
    *puVar1 = *puVar1 | -(ulong)((uVar12 & 0x3f) == 0) | ~(-1L << ((byte)uVar12 & 0x3f));
  }
  SelectionVector::Initialize(&this->left_sel,info->row_count);
  SelectionVector::Initialize(&this->active_rows_sel,info->row_count);
  if (info->has_initial == true) {
    *local_48.sel_vector = 0;
  }
  if (info->row_count == 0) {
    count = 0;
  }
  else {
    uVar12 = 0;
    count = 0;
    do {
      psVar3 = ((info->list_column_format).sel)->sel_vector;
      uVar11 = uVar12;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar12];
      }
      puVar4 = (info->list_column_format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
        if ((info->list_entries[uVar11].length == 0) && (info->has_initial == false)) {
          this_04 = (ParameterNotAllowedException *)__cxa_allocate_exception(0x10);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"Cannot perform list_reduce on an empty input list","");
          ParameterNotAllowedException::ParameterNotAllowedException(this_04,&local_88);
          __cxa_throw(this_04,&ParameterNotAllowedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_48.sel_vector[count] = (sel_t)info->list_entries[uVar11].offset;
        count = count + 1;
      }
      else {
        FlatVector::SetNull(info->result,uVar12,true);
        if ((this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_58 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88,&local_58);
          sVar7 = local_88._M_string_length;
          _Var6._M_p = local_88._M_dataplus._M_p;
          local_88._M_dataplus._M_p = (pointer)0x0;
          local_88._M_string_length = 0;
          p_Var2 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var6._M_p;
          (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(this->active_rows).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar12 & 0x3f;
        puVar1 = (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar12 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < info->row_count);
  }
  pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (this_00);
  Vector::Slice(pVVar9,&local_48,count);
  if (info->has_index == true) {
    LogicalType::LogicalType((LogicalType *)&local_88,BIGINT);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
    emplace_back<duckdb::LogicalType>
              (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (LogicalType *)&local_88);
    LogicalType::~LogicalType((LogicalType *)&local_88);
  }
  pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (this_00);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &pVVar9->type);
  pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (this_00);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &pVVar9->type);
  __n = (size_type)info->has_initial;
  uVar12 = ((long)(info->column_infos).
                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                  .
                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(info->column_infos).
                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                  .
                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (__n <= uVar12 && uVar12 - __n != 0) {
    do {
      pvVar10 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                          (&info->column_infos,__n);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &((pvVar10->vector)._M_data)->type);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(info->column_infos).
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(info->column_infos).
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  optional_ptr<duckdb::Expression,_true>::CheckValid(&info->lambda_expr);
  expression = (info->lambda_expr).ptr;
  this_03 = (ExpressionExecutor *)operator_new(0x48);
  ExpressionExecutor::ExpressionExecutor(this_03,local_50,expression);
  local_88._M_dataplus._M_p = (pointer)0x0;
  __ptr = *(ExpressionExecutor **)local_60;
  *(ExpressionExecutor **)local_60 = this_03;
  if (__ptr != (ExpressionExecutor *)0x0) {
    ::std::default_delete<duckdb::ExpressionExecutor>::operator()(local_60,__ptr);
  }
  if ((ExpressionExecutor *)local_88._M_dataplus._M_p != (ExpressionExecutor *)0x0) {
    ::std::default_delete<duckdb::ExpressionExecutor>::operator()
              ((default_delete<duckdb::ExpressionExecutor> *)&local_88,
               (ExpressionExecutor *)local_88._M_dataplus._M_p);
  }
  if (local_48.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

ReduceExecuteInfo(LambdaFunctions::LambdaInfo &info, ClientContext &context)
	    : left_slice(make_uniq<Vector>(*info.child_vector)) {
		if (info.has_initial) {
			initial_value_offset = 0;
		}
		SelectionVector left_vector(info.row_count);
		active_rows.Resize(info.row_count);
		active_rows.SetAllValid(info.row_count);

		left_sel.Initialize(info.row_count);
		active_rows_sel.Initialize(info.row_count);

		idx_t reduced_row_idx = 0;

		if (info.has_initial) {
			left_vector.set_index(0, 0);
		}

		for (idx_t original_row_idx = 0; original_row_idx < info.row_count; original_row_idx++) {
			auto list_column_format_index = info.list_column_format.sel->get_index(original_row_idx);
			if (info.list_column_format.validity.RowIsValid(list_column_format_index)) {
				if (info.list_entries[list_column_format_index].length == 0 && !info.has_initial) {
					throw ParameterNotAllowedException("Cannot perform list_reduce on an empty input list");
				}
				left_vector.set_index(reduced_row_idx, info.list_entries[list_column_format_index].offset);
				reduced_row_idx++;
			} else {
				// Set the row as invalid and remove it from the active rows.
				FlatVector::SetNull(info.result, original_row_idx, true);
				active_rows.SetInvalid(original_row_idx);
			}
		}
		left_slice->Slice(left_vector, reduced_row_idx);

		if (info.has_index) {
			input_types.push_back(LogicalType::BIGINT);
		}
		input_types.push_back(left_slice->GetType());
		input_types.push_back(left_slice->GetType());
		// skip the first entry if there is an initial value
		for (idx_t i = info.has_initial ? 1 : 0; i < info.column_infos.size(); i++) {
			input_types.push_back(info.column_infos[i].vector.get().GetType());
		}

		expr_executor = make_uniq<ExpressionExecutor>(context, *info.lambda_expr);
	}